

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O0

void TM_SSE2(uint8_t *dst,uint8_t *left,uint8_t *top,int size)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int in_ECX;
  undefined8 *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  __m128i top_values_1;
  __m128i out;
  __m128i base;
  int val;
  __m128i top_base;
  __m128i top_values;
  int y;
  __m128i zero;
  int local_20c;
  undefined8 *local_1e0;
  byte local_f8;
  byte bStack_f7;
  byte bStack_f6;
  byte bStack_f5;
  byte bStack_f4;
  byte bStack_f3;
  byte bStack_f2;
  byte bStack_f1;
  byte local_d8;
  byte bStack_d7;
  byte bStack_d6;
  byte bStack_d5;
  byte bStack_d4;
  byte bStack_d3;
  byte bStack_d2;
  byte bStack_d1;
  ushort uStack_86;
  ushort uStack_84;
  ushort uStack_82;
  ushort uStack_7e;
  ushort uStack_7c;
  ushort uStack_7a;
  __m128i out_2;
  __m128i out_1;
  __m128i out_0;
  __m128i base_1;
  int val_1;
  __m128i top_base_1;
  __m128i top_base_0;
  
  local_1e0 = in_RDI;
  if (in_ECX == 8) {
    uVar1 = *in_RDX;
    local_d8 = (byte)uVar1;
    bStack_d7 = (byte)((ulong)uVar1 >> 8);
    bStack_d6 = (byte)((ulong)uVar1 >> 0x10);
    bStack_d5 = (byte)((ulong)uVar1 >> 0x18);
    bStack_d4 = (byte)((ulong)uVar1 >> 0x20);
    bStack_d3 = (byte)((ulong)uVar1 >> 0x28);
    bStack_d2 = (byte)((ulong)uVar1 >> 0x30);
    bStack_d1 = (byte)((ulong)uVar1 >> 0x38);
    for (local_20c = 0; local_20c < 8; local_20c = local_20c + 1) {
      sVar18 = (ushort)*(byte *)(in_RSI + local_20c) - (ushort)*(byte *)(in_RSI + -1);
      out_0[1]._3_1_ = 0;
      out_0[1]._2_1_ = bStack_d7;
      out_0[1]._5_1_ = 0;
      out_0[1]._4_1_ = bStack_d6;
      out_0[1]._7_1_ = 0;
      out_0[1]._6_1_ = bStack_d5;
      base_1[0]._3_1_ = 0;
      base_1[0]._2_1_ = bStack_d3;
      base_1[0]._5_1_ = 0;
      base_1[0]._4_1_ = bStack_d2;
      base_1[0]._7_1_ = 0;
      base_1[0]._6_1_ = bStack_d1;
      sVar11 = sVar18 + (ushort)local_d8;
      sVar12 = sVar18 + out_0[1]._2_2_;
      sVar13 = sVar18 + out_0[1]._4_2_;
      sVar14 = sVar18 + out_0[1]._6_2_;
      sVar15 = sVar18 + (ushort)bStack_d4;
      sVar16 = sVar18 + base_1[0]._2_2_;
      sVar17 = sVar18 + base_1[0]._4_2_;
      sVar18 = sVar18 + base_1[0]._6_2_;
      *local_1e0 = CONCAT17((0 < sVar18) * (sVar18 < 0x100) * (char)sVar18 - (0xff < sVar18),
                            CONCAT16((0 < sVar17) * (sVar17 < 0x100) * (char)sVar17 -
                                     (0xff < sVar17),
                                     CONCAT15((0 < sVar16) * (sVar16 < 0x100) * (char)sVar16 -
                                              (0xff < sVar16),
                                              CONCAT14((0 < sVar15) * (sVar15 < 0x100) *
                                                       (char)sVar15 - (0xff < sVar15),
                                                       CONCAT13((0 < sVar14) * (sVar14 < 0x100) *
                                                                (char)sVar14 - (0xff < sVar14),
                                                                CONCAT12((0 < sVar13) *
                                                                         (sVar13 < 0x100) *
                                                                         (char)sVar13 -
                                                                         (0xff < sVar13),
                                                                         CONCAT11((0 < sVar12) *
                                                                                  (sVar12 < 0x100) *
                                                                                  (char)sVar12 -
                                                                                  (0xff < sVar12),
                                                                                  (0 < sVar11) *
                                                                                  (sVar11 < 0x100) *
                                                                                  (char)sVar11 -
                                                                                  (0xff < sVar11))))
                                                      ))));
      local_1e0 = local_1e0 + 4;
    }
  }
  else {
    uVar1 = *in_RDX;
    uVar2 = in_RDX[1];
    local_f8 = (byte)uVar1;
    bStack_f7 = (byte)((ulong)uVar1 >> 8);
    bStack_f6 = (byte)((ulong)uVar1 >> 0x10);
    bStack_f5 = (byte)((ulong)uVar1 >> 0x18);
    bStack_f4 = (byte)((ulong)uVar1 >> 0x20);
    bStack_f3 = (byte)((ulong)uVar1 >> 0x28);
    bStack_f2 = (byte)((ulong)uVar1 >> 0x30);
    bStack_f1 = (byte)((ulong)uVar1 >> 0x38);
    top_base_0[0]._0_1_ = (byte)uVar2;
    top_base_0[0]._1_1_ = (byte)((ulong)uVar2 >> 8);
    top_base_0[0]._2_1_ = (byte)((ulong)uVar2 >> 0x10);
    top_base_0[0]._3_1_ = (byte)((ulong)uVar2 >> 0x18);
    top_base_0[0]._4_1_ = (byte)((ulong)uVar2 >> 0x20);
    top_base_0[0]._5_1_ = (byte)((ulong)uVar2 >> 0x28);
    top_base_0[0]._6_1_ = (byte)((ulong)uVar2 >> 0x30);
    top_base_0[0]._7_1_ = (byte)((ulong)uVar2 >> 0x38);
    for (local_20c = 0; local_20c < 0x10; local_20c = local_20c + 1) {
      sVar18 = (ushort)*(byte *)(in_RSI + local_20c) - (ushort)*(byte *)(in_RSI + -1);
      out_2[1]._3_1_ = 0;
      out_2[1]._2_1_ = bStack_f7;
      out_2[1]._5_1_ = 0;
      out_2[1]._4_1_ = bStack_f6;
      out_2[1]._7_1_ = 0;
      out_2[1]._6_1_ = bStack_f5;
      out_1[0]._3_1_ = 0;
      out_1[0]._2_1_ = bStack_f3;
      out_1[0]._5_1_ = 0;
      out_1[0]._4_1_ = bStack_f2;
      out_1[0]._7_1_ = 0;
      out_1[0]._6_1_ = bStack_f1;
      sVar11 = sVar18 + (ushort)local_f8;
      sVar13 = sVar18 + out_2[1]._2_2_;
      sVar15 = sVar18 + out_2[1]._4_2_;
      sVar17 = sVar18 + out_2[1]._6_2_;
      sVar4 = sVar18 + (ushort)bStack_f4;
      sVar6 = sVar18 + out_1[0]._2_2_;
      sVar8 = sVar18 + out_1[0]._4_2_;
      sVar10 = sVar18 + out_1[0]._6_2_;
      uStack_86 = (ushort)top_base_0[0]._1_1_;
      uStack_84 = (ushort)top_base_0[0]._2_1_;
      uStack_82 = (ushort)top_base_0[0]._3_1_;
      uStack_7e = (ushort)top_base_0[0]._5_1_;
      uStack_7c = (ushort)top_base_0[0]._6_1_;
      uStack_7a = (ushort)top_base_0[0]._7_1_;
      sVar12 = sVar18 + (ushort)(byte)top_base_0[0];
      sVar14 = sVar18 + uStack_86;
      sVar16 = sVar18 + uStack_84;
      sVar3 = sVar18 + uStack_82;
      sVar5 = sVar18 + (ushort)top_base_0[0]._4_1_;
      sVar7 = sVar18 + uStack_7e;
      sVar9 = sVar18 + uStack_7c;
      sVar18 = sVar18 + uStack_7a;
      *local_1e0 = CONCAT17((0 < sVar10) * (sVar10 < 0x100) * (char)sVar10 - (0xff < sVar10),
                            CONCAT16((0 < sVar8) * (sVar8 < 0x100) * (char)sVar8 - (0xff < sVar8),
                                     CONCAT15((0 < sVar6) * (sVar6 < 0x100) * (char)sVar6 -
                                              (0xff < sVar6),
                                              CONCAT14((0 < sVar4) * (sVar4 < 0x100) * (char)sVar4 -
                                                       (0xff < sVar4),
                                                       CONCAT13((0 < sVar17) * (sVar17 < 0x100) *
                                                                (char)sVar17 - (0xff < sVar17),
                                                                CONCAT12((0 < sVar15) *
                                                                         (sVar15 < 0x100) *
                                                                         (char)sVar15 -
                                                                         (0xff < sVar15),
                                                                         CONCAT11((0 < sVar13) *
                                                                                  (sVar13 < 0x100) *
                                                                                  (char)sVar13 -
                                                                                  (0xff < sVar13),
                                                                                  (0 < sVar11) *
                                                                                  (sVar11 < 0x100) *
                                                                                  (char)sVar11 -
                                                                                  (0xff < sVar11))))
                                                      ))));
      local_1e0[1] = CONCAT17((0 < sVar18) * (sVar18 < 0x100) * (char)sVar18 - (0xff < sVar18),
                              CONCAT16((0 < sVar9) * (sVar9 < 0x100) * (char)sVar9 - (0xff < sVar9),
                                       CONCAT15((0 < sVar7) * (sVar7 < 0x100) * (char)sVar7 -
                                                (0xff < sVar7),
                                                CONCAT14((0 < sVar5) * (sVar5 < 0x100) * (char)sVar5
                                                         - (0xff < sVar5),
                                                         CONCAT13((0 < sVar3) * (sVar3 < 0x100) *
                                                                  (char)sVar3 - (0xff < sVar3),
                                                                  CONCAT12((0 < sVar16) *
                                                                           (sVar16 < 0x100) *
                                                                           (char)sVar16 -
                                                                           (0xff < sVar16),
                                                                           CONCAT11((0 < sVar14) *
                                                                                    (sVar14 < 0x100)
                                                                                    * (char)sVar14 -
                                                                                    (0xff < sVar14),
                                                                                    (0 < sVar12) *
                                                                                    (sVar12 < 0x100)
                                                                                    * (char)sVar12 -
                                                                                    (0xff < sVar12))
                                                                          ))))));
      local_1e0 = local_1e0 + 4;
    }
  }
  return;
}

Assistant:

static WEBP_INLINE void TM_SSE2(uint8_t* dst, const uint8_t* left,
                                const uint8_t* top, int size) {
  const __m128i zero = _mm_setzero_si128();
  int y;
  if (size == 8) {
    const __m128i top_values = _mm_loadl_epi64((const __m128i*)top);
    const __m128i top_base = _mm_unpacklo_epi8(top_values, zero);
    for (y = 0; y < 8; ++y, dst += BPS) {
      const int val = left[y] - left[-1];
      const __m128i base = _mm_set1_epi16(val);
      const __m128i out = _mm_packus_epi16(_mm_add_epi16(base, top_base), zero);
      _mm_storel_epi64((__m128i*)dst, out);
    }
  } else {
    const __m128i top_values = _mm_load_si128((const __m128i*)top);
    const __m128i top_base_0 = _mm_unpacklo_epi8(top_values, zero);
    const __m128i top_base_1 = _mm_unpackhi_epi8(top_values, zero);
    for (y = 0; y < 16; ++y, dst += BPS) {
      const int val = left[y] - left[-1];
      const __m128i base = _mm_set1_epi16(val);
      const __m128i out_0 = _mm_add_epi16(base, top_base_0);
      const __m128i out_1 = _mm_add_epi16(base, top_base_1);
      const __m128i out = _mm_packus_epi16(out_0, out_1);
      _mm_store_si128((__m128i*)dst, out);
    }
  }
}